

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void MemHashLinkRecord(mem_hash_kv_engine *pEngine,mem_hash_record *pRecord)

{
  uint uVar1;
  sxu32 nBucket;
  mem_hash_record *pRecord_local;
  mem_hash_kv_engine *pEngine_local;
  
  uVar1 = pRecord->nHash & pEngine->nBucket - 1;
  pRecord->pNextHash = pEngine->apBucket[uVar1];
  if (pEngine->apBucket[uVar1] != (mem_hash_record *)0x0) {
    pEngine->apBucket[uVar1]->pPrevHash = pRecord;
  }
  pEngine->apBucket[uVar1] = pRecord;
  if (pEngine->pFirst == (mem_hash_record *)0x0) {
    pEngine->pLast = pRecord;
    pEngine->pFirst = pRecord;
  }
  else if (pEngine->pLast == (mem_hash_record *)0x0) {
    pEngine->pLast = pRecord;
  }
  else {
    pRecord->pNext = pEngine->pLast;
    pEngine->pLast->pPrev = pRecord;
    pEngine->pLast = pRecord;
  }
  pEngine->nRecord = pEngine->nRecord + 1;
  return;
}

Assistant:

static void MemHashLinkRecord(mem_hash_kv_engine *pEngine,mem_hash_record *pRecord)
{
	sxu32 nBucket = pRecord->nHash & (pEngine->nBucket - 1);
	pRecord->pNextHash = pEngine->apBucket[nBucket];
	if( pEngine->apBucket[nBucket] ){
		pEngine->apBucket[nBucket]->pPrevHash = pRecord;
	}
	pEngine->apBucket[nBucket] = pRecord;
	if( pEngine->pFirst == 0 ){
		pEngine->pFirst = pEngine->pLast = pRecord;
	}else{
		MACRO_LD_PUSH(pEngine->pLast,pRecord);
	}
	pEngine->nRecord++;
}